

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::socks5_stream::connect1<libtorrent::aux::peer_connection::start()::__0>
          (socks5_stream *this,error_code *e,anon_class_16_1_898a5c2a *h)

{
  bool bVar1;
  anon_class_16_1_898a5c2a *u;
  __0 local_60 [16];
  socks5_stream *local_50;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_socks5_stream_hpp:409:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_peer_connection_cpp:424:6)>
  local_48;
  mutable_buffer local_30;
  anon_class_16_1_898a5c2a *local_20;
  anon_class_16_1_898a5c2a *h_local;
  error_code *e_local;
  socks5_stream *this_local;
  
  local_20 = h;
  h_local = (anon_class_16_1_898a5c2a *)e;
  e_local = (error_code *)this;
  bVar1 = libtorrent::aux::proxy_base::handle_error<libtorrent::aux::peer_connection::start()::__0>
                    (&this->super_proxy_base,e,h);
  if (!bVar1) {
    if (this->m_version == 5) {
      ::std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,10);
    }
    else if (this->m_version == 4) {
      ::std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,8);
    }
    local_30 = boost::asio::buffer<char,std::allocator<char>>(&this->m_buffer);
    u = (anon_class_16_1_898a5c2a *)local_30.data_;
    local_50 = this;
    libtorrent::aux::peer_connection::start()::$_0::__0(local_60,h);
    libtorrent::aux::
    wrap_allocator<libtorrent::socks5_stream::connect1<libtorrent::aux::peer_connection::start()::__0>(boost::system::error_code_const&,libtorrent::aux::peer_connection::start()::__0)::_lambda(boost::system::error_code_const&,unsigned_long,libtorrent::aux::peer_connection::start()::__0)_1_,libtorrent::aux::peer_connection::start()::__0>
              (&local_48,(aux *)local_50,(socks5_stream *)local_60,u);
    boost::asio::
    async_read<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,boost::asio::mutable_buffer,libtorrent::aux::wrap_allocator_t<libtorrent::socks5_stream::connect1<libtorrent::aux::peer_connection::start()::__0>(boost::system::error_code_const&,libtorrent::aux::peer_connection::start()::__0)::_lambda(boost::system::error_code_const&,unsigned_long,libtorrent::aux::peer_connection::start()::__0)_1_,libtorrent::aux::peer_connection::start()::__0>>
              ((noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                *)this,&local_30,&local_48,(type *)0x0);
    libtorrent::aux::
    wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/socks5_stream.hpp:409:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/peer_connection.cpp:424:6)>
    ::~wrap_allocator_t(&local_48);
    libtorrent::aux::peer_connection::start()::$_0::~__0(local_60);
  }
  return;
}

Assistant:

void connect1(error_code const& e, Handler h)
	{
		COMPLETE_ASYNC("socks5_stream::connect1");
		if (handle_error(e, std::move(h))) return;

		if (m_version == 5)
			m_buffer.resize(6 + 4); // assume an IPv4 address
		else if (m_version == 4)
			m_buffer.resize(8);

		ADD_OUTSTANDING_ASYNC("socks5_stream::connect2");
		async_read(m_sock, boost::asio::buffer(m_buffer), aux::wrap_allocator(
			[this](error_code const& ec, std::size_t, Handler hn) {
				connect2(ec, std::move(hn));
			}, std::move(h)));
	}